

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

int mpt::type_properties<mpt::span<mpt::metatype::value<double>_*const>_>::id(bool obtain)

{
  uint uVar1;
  type_traits *ptVar2;
  
  if (0 < id::_valtype) {
    return id::_valtype;
  }
  if ((metatype::value<double>::pointer_traits(bool)::traits == 0) ||
     (uVar1 = *(int *)(metatype::value<double>::pointer_traits(bool)::traits + 0x10) + 0xe0U & 0xff,
     *(int *)(metatype::value<double>::pointer_traits(bool)::traits + 0x10) - 0x7bU < 0xffffffe5 ||
     uVar1 == 0)) {
    if (!obtain) {
      return -3;
    }
    ptVar2 = _dynamic_traits();
    uVar1 = mpt::type_traits::add(ptVar2);
  }
  id::_valtype = uVar1;
  return uVar1;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}